

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
GameInfoIRCCommand::trigger
          (GameInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  IRC_Bot *pIVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  size_t sVar8;
  undefined8 extraout_RDX;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  uint uVar10;
  string local_c0;
  undefined4 local_9c;
  IRC_Bot *local_98;
  char *local_90;
  long local_88;
  long local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar7 = channel._M_str;
  sVar8 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar8,pcVar7,pcVar7,nick._M_len);
  if (lVar3 != 0) {
    local_98 = source;
    local_9c = Jupiter::IRC::Client::Channel::getType();
    bVar9 = false;
    uVar10 = 0;
    local_90 = pcVar7;
    while( true ) {
      RenX::getCore();
      uVar4 = RenX::Core::getServerCount();
      if (uVar4 == uVar10) break;
      uVar4 = RenX::getCore();
      lVar3 = RenX::Core::getServer(uVar4);
      cVar2 = RenX::Server::isLogChanType((int)lVar3);
      if (cVar2 != '\0') {
        lVar5 = RenX::Server::getMap();
        local_80 = RenX::Server::getGameTime();
        local_78 = local_80 / 1000;
        uVar6 = RenX::Server::getGameVersion();
        pIVar1 = local_98;
        local_88 = lVar3;
        RenX::Server::getGameVersion();
        string_printf_abi_cxx11_(&local_c0,"\x0303[GameInfo] \x03%.*s",uVar6,extraout_RDX);
        pcVar7 = local_90;
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,sVar8,local_90,local_c0._M_string_length,local_c0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_c0);
        local_60._0_8_ = 0x17;
        local_60._8_8_ = "\x0303[GameInfo] \x0310Map\x03: ";
        local_70._0_8_ = (pointer)0xc;
        local_70._8_8_ = "; \x0310GUID\x03: ";
        RenX::formatGUID_abi_cxx11_((Map *)local_50);
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_c0,(jessilib *)local_60,
                   (basic_string_view<char,_std::char_traits<char>_> *)(lVar5 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   local_50,args_3);
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,sVar8,pcVar7,local_c0._M_string_length,local_c0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)local_50);
        string_printf_abi_cxx11_
                  (&local_c0,"\x0303[GameInfo] \x0310Elapsed time\x03: %.2lld:%.2lld:%.2lld",
                   local_80 / 3600000,(long)(short)((short)(local_78 % 0xe10) / 0x3c),
                   local_78 % 0x3c);
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,sVar8,pcVar7,local_c0._M_string_length,local_c0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_c0);
        string_printf_abi_cxx11_
                  (&local_c0,"\x0303[GameInfo] \x03There are \x0310%d\x03 players online.",
                   *(undefined8 *)(local_88 + 0x20));
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,sVar8,pcVar7,local_c0._M_string_length,local_c0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_c0);
        bVar9 = true;
      }
      uVar10 = uVar10 + 1;
    }
    if (!bVar9) {
      Jupiter::IRC::Client::sendMessage
                (local_98,sVar8,pcVar7,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
  }
  return;
}

Assistant:

void GameInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				const RenX::Map &map = server->getMap();
				std::chrono::seconds time = std::chrono::duration_cast<std::chrono::seconds>(server->getGameTime());
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "%.*s", server->getGameVersion().size(), server->getGameVersion().data()));
				source->sendMessage(channel, jessilib::join<std::string>(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Map" IRCCOLOR ": "sv, map.name, "; " IRCCOLOR "10GUID" IRCCOLOR ": "sv, RenX::formatGUID(map)));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "10Elapsed time" IRCCOLOR ": %.2lld:%.2lld:%.2lld", time.count() / 3600, (time.count() % 3600) / 60, time.count() % 60));
				source->sendMessage(channel, string_printf(IRCCOLOR "03[GameInfo] " IRCCOLOR "There are " IRCCOLOR "10%d" IRCCOLOR " players online.", server->players.size()));
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}